

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::loop
          (TestMoreStuffImpl *this,uint depth,Client *cap,ExpectCancelContext context)

{
  long lVar1;
  _func_int **pp_Var2;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  undefined4 in_register_00000034;
  Disposer *in_R8;
  Promise<void> PVar4;
  _func_int **local_88;
  char *local_80;
  undefined1 local_78 [24];
  Disposer *local_60;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  if ((uint)cap < 0x65) {
    local_80 = (char *)CONCAT44(local_80._4_4_,(uint)cap);
    local_88 = (_func_int **)CONCAT44(in_register_00000034,depth);
    capnproto_test::capnp::test::TestInterface::Client::Client
              ((Client *)local_78,(Client *)context.hook);
    local_60 = in_R8;
    kj::_::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x58);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1118:26),_kj::_::PropagateException>
               ::anon_class_48_4_ba8e04f4_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00395450;
    this_00[1].super_PromiseNode._vptr_PromiseNode = local_88;
    *(undefined4 *)&this_00[1].dependency.disposer = local_80._0_4_;
    lVar1 = *(long *)(CONCAT44(local_78._4_4_,local_78._0_4_) + -0x18);
    pp_Var2 = *(_func_int ***)(local_78 + lVar1 + 8);
    this_00[1].continuationTracePtr = *(void **)(local_78 + lVar1);
    this_00[2].super_PromiseNode._vptr_PromiseNode = pp_Var2;
    *(undefined8 *)(local_78 + lVar1 + 8) = 0;
    this_00[1].dependency.ptr = (PromiseNode *)&Capability::Client::typeinfo;
    this_00[2].dependency.disposer = local_60;
    intermediate.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::TestMoreStuffImpl::loop(unsigned_int,capnproto_test::capnp::test::TestInterface::Client,capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>)::$_0,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    kj::_::maybeChain<void>(&local_38,(Promise<void> *)&intermediate);
    pPVar3 = local_38.ptr;
    local_28.disposer = local_38.disposer;
    local_38.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_38);
    *(Disposer **)&this->super_Server = local_38.disposer;
    *(PromiseNode **)&(this->super_Server).field_0x8 = pPVar3;
    local_28.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode>::dispose(&local_28);
    kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
    kj::Own<kj::_::PromiseNode>::dispose(&local_58);
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_78 + 8));
    pPVar3 = extraout_RDX_00;
  }
  else {
    local_88 = (_func_int **)((ulong)local_88 & 0xffffffffffffff00);
    local_80 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
    ;
    local_78._0_4_ = 0x45b;
    kj::AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&local_88,(char (*) [28])"Looped too long, giving up.");
    kj::AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&local_88);
    kj::Promise<void>::Promise((Promise<void> *)this);
    pPVar3 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::loop(uint depth, test::TestInterface::Client cap,
                                          ExpectCancelContext context) {
  if (depth > 100) {
    ADD_FAILURE() << "Looped too long, giving up.";
    return kj::READY_NOW;
  } else {
    return kj::evalLater([this,depth,KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
      return loop(depth + 1, cap, context);
    });
  }